

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

BufferWithRandomAccess * __thiscall
wasm::BufferWithRandomAccess::operator<<(BufferWithRandomAccess *this,int32_t x)

{
  value_type_conflict2 local_18;
  value_type_conflict2 local_17;
  value_type_conflict2 local_16;
  value_type_conflict2 local_15;
  int local_14;
  BufferWithRandomAccess *pBStack_10;
  int32_t x_local;
  BufferWithRandomAccess *this_local;
  
  local_15 = (value_type_conflict2)x;
  local_14 = x;
  pBStack_10 = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_15);
  local_16 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_16);
  local_17 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_17);
  local_18 = (value_type_conflict2)((uint)local_14 >> 8);
  local_14 = local_14 >> 8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_18);
  return this;
}

Assistant:

BufferWithRandomAccess& operator<<(int32_t x) {
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    x >>= 8;
    push_back(x & 0xff);
    return *this;
  }